

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O1

void __thiscall S2Cell::S2Cell(S2Cell *this,S2CellId id)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  int ij [2];
  int orientation;
  int iStack_58;
  int local_54;
  S2CellId local_50;
  int8 local_44 [4];
  R2Rect local_40;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c17b8;
  (this->id_).id_ = 0;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)(this->uv_).bounds_[0].bounds_.c_ + lVar3) = 0x3ff0000000000000;
    *(undefined8 *)((long)(this->uv_).bounds_[0].bounds_.c_ + lVar3 + 8) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x20);
  local_50.id_ = id.id_;
  if ((this->uv_).bounds_[1].bounds_.c_[0] <= (this->uv_).bounds_[1].bounds_.c_[1] ==
      (this->uv_).bounds_[0].bounds_.c_[1] < (this->uv_).bounds_[0].bounds_.c_[0]) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
               ,0xb1,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_40.bounds_[0].bounds_.c_[1],"Check failed: is_valid() ",0x19);
  }
  else {
    (this->id_).id_ = id.id_;
    iVar2 = S2CellId::ToFaceIJOrientation(&local_50,&iStack_58,&local_54,(int *)local_44);
    this->face_ = (int8)iVar2;
    this->orientation_ = local_44[0];
    if (local_50.id_ != 0) {
      uVar1 = 0;
      if (local_50.id_ != 0) {
        for (; (local_50.id_ >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      iVar2 = 0x1e - ((uint)(uVar1 >> 1) & 0x7fffffff);
      this->level_ = (int8)iVar2;
      S2CellId::IJLevelToBoundUV(&local_40,&iStack_58,iVar2);
      (this->uv_).bounds_[1].bounds_.c_[0] = local_40.bounds_[1].bounds_.c_[0];
      (this->uv_).bounds_[1].bounds_.c_[1] = local_40.bounds_[1].bounds_.c_[1];
      (this->uv_).bounds_[0].bounds_.c_[0] = local_40.bounds_[0].bounds_.c_[0];
      (this->uv_).bounds_[0].bounds_.c_[1] = local_40.bounds_[0].bounds_.c_[1];
      return;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x223,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_40.bounds_[0].bounds_.c_[1],"Check failed: id_ != 0 ",0x17);
  }
  abort();
}

Assistant:

S2Cell::S2Cell(S2CellId id) {
  id_ = id;
  int ij[2], orientation;
  face_ = id.ToFaceIJOrientation(&ij[0], &ij[1], &orientation);
  orientation_ = orientation;  // Compress int to a byte.
  level_ = id.level();
  uv_ = S2CellId::IJLevelToBoundUV(ij, level_);
}